

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

void Abc_BufPerformOne(Buf_Man_t *p,int iPivot,int fSkipDup,int fVerbose)

{
  uint uVar1;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  Abc_Obj_t *pAVar10;
  Vec_Int_t *pVVar11;
  Mio_Gate_t *pMVar12;
  Vec_Ptr_t *pVVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  double dVar22;
  
  pVVar13 = p->pNtk->vObjs;
  iVar4 = pVVar13->nSize;
  if (p->nObjAlloc <= iVar4 + 0x1e) {
    __assert_fail("Abc_NtkObjNumMax(p->pNtk) + 30 < p->nObjAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                  ,0x36a,"void Abc_BufPerformOne(Buf_Man_t *, int, int, int)");
  }
  if ((iPivot < 0) || (iVar4 <= iPivot)) {
LAB_00455721:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pObj = (Abc_Obj_t *)pVVar13->pArray[(uint)iPivot];
  iVar4 = Abc_BufCountNonCritical(p,pObj);
  uVar20 = (pObj->vFanouts).nSize - iVar4;
  if (fVerbose != 0) {
    uVar1 = pObj->Id;
    pcVar9 = Mio_GateReadName((Mio_Gate_t *)(pObj->field_5).pData);
    printf("ObjId = %6d : %-10s   FI = %d. FO =%4d.  Crit =%4d.  ",(ulong)uVar1,pcVar9,
           (ulong)(uint)(pObj->vFanins).nSize,(ulong)(uint)(pObj->vFanouts).nSize,(ulong)uVar20);
  }
  if (1 < iVar4 && 0 < (int)uVar20) {
    pAVar10 = Abc_NtkCreateNodeBuf(p->pNtk,pObj);
    pVVar11 = p->vNonCrit;
    if (0 < pVVar11->nSize) {
      lVar17 = 0;
      do {
        iVar4 = pVVar11->pArray[lVar17];
        if (((long)iVar4 < 0) || (pVVar13 = p->pNtk->vObjs, pVVar13->nSize <= iVar4))
        goto LAB_00455721;
        pObj_00 = (Abc_Obj_t *)pVVar13->pArray[iVar4];
        if (pObj_00 != (Abc_Obj_t *)0x0) {
          Abc_ObjPatchFanin(pObj_00,pObj,pAVar10);
        }
        lVar17 = lVar17 + 1;
        pVVar11 = p->vNonCrit;
      } while (lVar17 < pVVar11->nSize);
    }
    Abc_BufCreateEdges(p,pAVar10);
    Abc_BufUpdateArr(p,pAVar10);
    Abc_BufUpdateDep(p,pAVar10);
    Abc_BufAddToQue(p,pObj);
    Abc_BufAddToQue(p,pAVar10);
    Abc_SclTimeIncUpdateLevel(pAVar10);
    p->nSeparate = p->nSeparate + 1;
    if (fVerbose == 0) {
      return;
    }
    pcVar9 = "Adding buffer";
LAB_00455427:
    puts(pcVar9);
    return;
  }
  if ((((fSkipDup == 0) && (0 < (int)uVar20)) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) &&
     (p->nFanMin < (pObj->vFanouts).nSize)) {
    pAVar10 = Abc_NtkDupObj(p->pNtk,pObj,0);
    if (0 < (pObj->vFanins).nSize) {
      lVar17 = 0;
      do {
        Abc_ObjAddFanin(pAVar10,(Abc_Obj_t *)
                                pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar17]]);
        lVar17 = lVar17 + 1;
      } while (lVar17 < (pObj->vFanins).nSize);
    }
    Abc_NodeCollectFanouts(pObj,p->vFanouts);
    pVVar13 = p->vFanouts;
    iVar4 = pVVar13->nSize;
    if (1 < iVar4) {
      lVar17 = 0;
      do {
        if (iVar4 <= lVar17) goto LAB_00455721;
        Abc_ObjPatchFanin((Abc_Obj_t *)pVVar13->pArray[lVar17],pObj,pAVar10);
        lVar17 = lVar17 + 1;
        pVVar13 = p->vFanouts;
        iVar4 = pVVar13->nSize;
      } while (lVar17 < iVar4 / 2);
    }
    Abc_BufCreateEdges(p,pAVar10);
    iVar4 = pObj->Id;
    if (-1 < (long)iVar4) {
      iVar6 = p->vArr->nSize;
      if (iVar4 < iVar6) {
        iVar7 = pAVar10->Id;
        if (((long)iVar7 < 0) || (iVar6 <= iVar7)) {
LAB_0045579d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar2 = p->vArr->pArray;
        piVar2[iVar7] = piVar2[iVar4];
        Abc_BufUpdateDep(p,pObj);
        Abc_BufUpdateDep(p,pAVar10);
        Abc_BufAddToQue(p,pObj);
        Abc_BufAddToQue(p,pAVar10);
        if (0 < (pObj->vFanins).nSize) {
          lVar17 = 0;
          do {
            Abc_BufAddToQue(p,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar17]]
                           );
            lVar17 = lVar17 + 1;
          } while (lVar17 < (pObj->vFanins).nSize);
        }
        Abc_SclTimeIncUpdateLevel(pAVar10);
        p->nDuplicate = p->nDuplicate + 1;
        if (fVerbose == 0) {
          return;
        }
        pcVar9 = "Duplicating node";
        goto LAB_00455427;
      }
    }
LAB_0045577e:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if ((((int)uVar20 < 1) || ((pObj->vFanouts).nSize < 9)) && ((pObj->vFanouts).nSize <= p->nFanMax))
  {
    if (fVerbose == 0) {
      return;
    }
    pcVar9 = "Doing nothing";
    goto LAB_00455427;
  }
  dVar22 = (double)(pObj->vFanouts).nSize;
  uVar1 = p->pNtk->vObjs->nSize;
  uVar19 = (ulong)uVar1;
  if (dVar22 < 0.0) {
    dVar22 = sqrt(dVar22);
  }
  else {
    dVar22 = SQRT(dVar22);
  }
  uVar5 = (uint)ABS(dVar22);
  uVar16 = 10;
  if ((int)uVar5 < 10) {
    uVar16 = uVar5;
  }
  iVar4 = (pObj->vFanouts).nSize;
  iVar6 = iVar4 / (int)uVar16;
  iVar4 = iVar4 % (int)uVar16;
  p->nBranchCrit = p->nBranchCrit + (uint)(0 < (int)uVar20);
  Abc_NodeCollectFanouts(pObj,p->vFanouts);
  if (((*(uint *)&pObj->field_0x14 & 0xf) == 7) && (iVar7 = Abc_NodeIsBuf(pObj), iVar7 != 0)) {
    p->nBranch0 = p->nBranch0 + 1;
    pMVar12 = Mio_LibraryReadInv((Mio_Library_t *)p->pNtk->pManFunc);
    (pObj->field_5).pData = pMVar12;
    iVar7 = pObj->Id;
    if (((long)iVar7 < 0) || (p->vOffsets->nSize <= iVar7)) goto LAB_0045577e;
    iVar7 = p->vOffsets->pArray[iVar7];
    if (((long)iVar7 < 0) || (p->vEdges->nSize <= iVar7)) goto LAB_0045579d;
    p->vEdges->pArray[iVar7] = 1000;
    iVar7 = Abc_NodeIsInv(pObj);
    if (iVar7 == 0) {
      __assert_fail("Abc_NodeIsInv(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                    ,0x3b1,"void Abc_BufPerformOne(Buf_Man_t *, int, int, int)");
    }
    uVar20 = uVar16;
    if (0 < (int)uVar5) {
      do {
        Abc_NtkCreateNodeInv(p->pNtk,pObj);
        uVar20 = uVar20 - 1;
      } while (uVar20 != 0);
    }
    if (fVerbose == 0) goto LAB_00455575;
    pcVar9 = "Adding %d inverters\n";
  }
  else {
    p->nBranch1 = p->nBranch1 + 1;
    uVar20 = uVar16;
    if (0 < (int)uVar5) {
      do {
        Abc_NtkCreateNodeBuf(p->pNtk,pObj);
        uVar20 = uVar20 - 1;
      } while (uVar20 != 0);
    }
    if (fVerbose == 0) goto LAB_00455575;
    pcVar9 = "Adding %d buffers\n";
  }
  printf(pcVar9,(ulong)uVar16);
LAB_00455575:
  pVVar13 = p->vFanouts;
  if (0 < pVVar13->nSize) {
    iVar7 = iVar6 + 1;
    iVar14 = iVar7 * iVar4;
    uVar15 = 0;
    do {
      if ((long)uVar15 < (long)iVar14) {
        iVar8 = (int)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff) /
                     (long)iVar7);
      }
      else {
        iVar8 = ((int)uVar15 - iVar14) / iVar6 + iVar4;
      }
      if ((iVar8 < 0) || ((int)uVar16 <= iVar8)) {
        __assert_fail("j >= 0 && j < nDegree",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                      ,0x3c3,"void Abc_BufPerformOne(Buf_Man_t *, int, int, int)");
      }
      uVar20 = iVar8 + uVar1;
      if (((int)uVar20 < 0) || (pVVar3 = p->pNtk->vObjs, pVVar3->nSize <= (int)uVar20))
      goto LAB_00455721;
      Abc_ObjPatchFanin((Abc_Obj_t *)pVVar13->pArray[uVar15],pObj,
                        (Abc_Obj_t *)pVVar3->pArray[uVar20]);
      uVar15 = uVar15 + 1;
      pVVar13 = p->vFanouts;
    } while ((long)uVar15 < (long)pVVar13->nSize);
  }
  uVar21 = (ulong)uVar16;
  uVar15 = uVar19;
  uVar18 = uVar21;
  if (0 < (int)uVar5) {
    do {
      if (((int)uVar1 < 0) || (pVVar13 = p->pNtk->vObjs, pVVar13->nSize <= (int)uVar15))
      goto LAB_00455721;
      Abc_BufCreateEdges(p,(Abc_Obj_t *)pVVar13->pArray[uVar15]);
      uVar18 = uVar18 - 1;
      uVar15 = uVar15 + 1;
    } while (uVar18 != 0);
  }
  Abc_BufUpdateArr(p,pObj);
  uVar15 = uVar19;
  uVar18 = uVar21;
  if (0 < (int)uVar5) {
    do {
      if (((int)uVar1 < 0) || (pVVar13 = p->pNtk->vObjs, pVVar13->nSize <= (int)uVar15))
      goto LAB_00455721;
      Abc_BufComputeDep(p,(Abc_Obj_t *)pVVar13->pArray[uVar15]);
      uVar18 = uVar18 - 1;
      uVar15 = uVar15 + 1;
    } while (uVar18 != 0);
  }
  Abc_BufUpdateDep(p,pObj);
  uVar15 = uVar19;
  uVar18 = uVar21;
  if (0 < (int)uVar5) {
    do {
      if (((int)uVar1 < 0) || (pVVar13 = p->pNtk->vObjs, pVVar13->nSize <= (int)uVar15))
      goto LAB_00455721;
      Abc_BufAddToQue(p,(Abc_Obj_t *)pVVar13->pArray[uVar15]);
      uVar18 = uVar18 - 1;
      uVar15 = uVar15 + 1;
    } while (uVar18 != 0);
  }
  if (0 < (int)uVar5) {
    do {
      if (((int)uVar1 < 0) || (pVVar13 = p->pNtk->vObjs, pVVar13->nSize <= (int)uVar19))
      goto LAB_00455721;
      Abc_SclTimeIncUpdateLevel((Abc_Obj_t *)pVVar13->pArray[uVar19]);
      uVar19 = uVar19 + 1;
      uVar21 = uVar21 - 1;
    } while (uVar21 != 0);
  }
  return;
}

Assistant:

void Abc_BufPerformOne( Buf_Man_t * p, int iPivot, int fSkipDup, int fVerbose )
{
    Abc_Obj_t * pObj, * pFanout;
    int i, j, nCrit, nNonCrit;
//    int DelayMax = p->DelayMax;
    assert( Abc_NtkObjNumMax(p->pNtk) + 30 < p->nObjAlloc );
    pObj     = Abc_NtkObj( p->pNtk, iPivot );
//    assert( Vec_FltEntry(p->vCounts, iPivot) == (float)Abc_ObjFanoutNum(pObj) );
    nNonCrit = Abc_BufCountNonCritical( p, pObj );
    nCrit    = Abc_ObjFanoutNum(pObj) - nNonCrit;
if ( fVerbose )
{
//Abc_BufPrintOne( p, iPivot );
printf( "ObjId = %6d : %-10s   FI = %d. FO =%4d.  Crit =%4d.  ", 
    Abc_ObjId(pObj), Mio_GateReadName((Mio_Gate_t *)pObj->pData), Abc_ObjFaninNum(pObj), Abc_ObjFanoutNum(pObj), nCrit );
}
    // consider three cases
    if ( nCrit > 0 && nNonCrit > 1 )
    {
        // (1) both critical and non-critical are present - split them by adding buffer
        Abc_Obj_t * pBuffer = Abc_NtkCreateNodeBuf( p->pNtk, pObj );
        Abc_NtkForEachObjVec( p->vNonCrit, p->pNtk, pFanout, i )
            Abc_ObjPatchFanin( pFanout, pObj, pBuffer );
        // update timing
        Abc_BufCreateEdges( p, pBuffer );
        Abc_BufUpdateArr( p, pBuffer );
        Abc_BufUpdateDep( p, pBuffer );
        Abc_BufAddToQue( p, pObj );
        Abc_BufAddToQue( p, pBuffer );
        Abc_SclTimeIncUpdateLevel( pBuffer );
        p->nSeparate++;
if ( fVerbose )
printf( "Adding buffer\n" );
    }
    else if ( !fSkipDup && nCrit > 0 && Abc_ObjIsNode(pObj) && Abc_ObjFanoutNum(pObj) > p->nFanMin )//&& Abc_ObjLevel(pObj) < 4 )//&& Abc_ObjFaninNum(pObj) < 2 )
    {
        // (2) only critical are present - duplicate
        Abc_Obj_t * pClone = Abc_NtkDupObj( p->pNtk, pObj, 0 );
        Abc_ObjForEachFanin( pObj, pFanout, i )
            Abc_ObjAddFanin( pClone, pFanout );
        Abc_NodeCollectFanouts( pObj, p->vFanouts );
        Vec_PtrForEachEntryStop( Abc_Obj_t *, p->vFanouts, pFanout, i, Vec_PtrSize(p->vFanouts)/2 )
            Abc_ObjPatchFanin( pFanout, pObj, pClone );
        // update timing
        Abc_BufCreateEdges( p, pClone );
        Abc_BufSetNodeArr( p, pClone, Abc_BufNodeArr(p, pObj) );
        Abc_BufUpdateDep( p, pObj );
        Abc_BufUpdateDep( p, pClone );
        Abc_BufAddToQue( p, pObj );
        Abc_BufAddToQue( p, pClone );
        Abc_ObjForEachFanin( pObj, pFanout, i )
            Abc_BufAddToQue( p, pFanout );
        Abc_SclTimeIncUpdateLevel( pClone );
        p->nDuplicate++;
//        printf( "Duplicating %s on level %d\n", Mio_GateReadName((Mio_Gate_t *)pObj->pData), Abc_ObjLevel(pObj) );
if ( fVerbose )
printf( "Duplicating node\n" );
    }
    else if ( (nCrit > 0 && Abc_ObjFanoutNum(pObj) > 8) || Abc_ObjFanoutNum(pObj) > p->nFanMax )
    {
        // (2) only critical or only non-critical - add buffer/inverter tree
        int nDegree, n1Degree, n1Number, nFirst;
        int iFirstBuf = Abc_NtkObjNumMax( p->pNtk );
//        nDegree  = Abc_MinInt( 3, (int)pow(Abc_ObjFanoutNum(pObj), 0.34) );
        nDegree  = Abc_MinInt( 10, (int)pow(Abc_ObjFanoutNum(pObj), 0.5) );
        n1Degree = Abc_ObjFanoutNum(pObj) / nDegree + 1;
        n1Number = Abc_ObjFanoutNum(pObj) % nDegree;
        nFirst   = n1Degree * n1Number;
        p->nBranchCrit += (nCrit > 0);
        // create inverters
        Abc_NodeCollectFanouts( pObj, p->vFanouts );
        if ( Abc_ObjIsNode(pObj) && Abc_NodeIsBuf(pObj) )
        {
            p->nBranch0++;
            pObj->pData = Mio_LibraryReadInv((Mio_Library_t *)p->pNtk->pManFunc);
            Abc_BufSetEdgeDelay( p, pObj, 0, BUF_SCALE );
            assert( Abc_NodeIsInv(pObj) );
            for ( i = 0; i < nDegree; i++ )
                Abc_NtkCreateNodeInv( p->pNtk, pObj );
if ( fVerbose )
printf( "Adding %d inverters\n", nDegree );
        }
        else
        {
            p->nBranch1++;
            for ( i = 0; i < nDegree; i++ )
                Abc_NtkCreateNodeBuf( p->pNtk, pObj );
if ( fVerbose )
printf( "Adding %d buffers\n", nDegree );
        }
        // connect inverters
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanouts, pFanout, i )
        {
            j = (i < nFirst) ? i/n1Degree : n1Number + ((i - nFirst)/(n1Degree - 1));
            assert( j >= 0 && j < nDegree );
            Abc_ObjPatchFanin( pFanout, pObj, Abc_NtkObj(p->pNtk, iFirstBuf + j) );
        }
        // update timing
        for ( i = 0; i < nDegree; i++ )
            Abc_BufCreateEdges( p, Abc_NtkObj(p->pNtk, iFirstBuf + i) );
        Abc_BufUpdateArr( p, pObj );
        for ( i = 0; i < nDegree; i++ )
            Abc_BufComputeDep( p, Abc_NtkObj(p->pNtk, iFirstBuf + i) );
        Abc_BufUpdateDep( p, pObj );
        for ( i = 0; i < nDegree; i++ )
            Abc_BufAddToQue( p, Abc_NtkObj(p->pNtk, iFirstBuf + i) );
        for ( i = 0; i < nDegree; i++ )
            Abc_SclTimeIncUpdateLevel( Abc_NtkObj(p->pNtk, iFirstBuf + i) );
    }
    else
    {
if ( fVerbose )
printf( "Doing nothing\n" );
    }
//    if ( DelayMax != p->DelayMax )
//        printf( "%d (%.2f)  ", p->DelayMax, 1.0 * p->DelayMax * p->DelayInv / BUF_SCALE );
}